

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

void net_uv::TCPSocket::server_on_after_new_connection(uv_stream_t *server,int32_t status)

{
  char *pcVar1;
  TCPSocket *s;
  int32_t status_local;
  uv_stream_t *server_local;
  
  if (status == 0) {
    std::function<void_(uv_stream_s_*,_int)>::operator()
              ((function<void_(uv_stream_s_*,_int)> *)((long)server->data + 0xa8),server,0);
  }
  else {
    pcVar1 = uv_strerror(status);
    net_uvLog(3,"tcp new connection error %s",pcVar1);
  }
  return;
}

Assistant:

void TCPSocket::server_on_after_new_connection(uv_stream_t *server, int32_t status) 
{
	if (status != 0)
	{
		NET_UV_LOG(NET_UV_L_ERROR, "tcp new connection error %s", uv_strerror(status));
		return;
	}
	TCPSocket* s = (TCPSocket*)server->data;
	s->m_newConnectionCall(server, status);
}